

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stepper.cpp
# Opt level: O2

void __thiscall QtMWidgets::Stepper::Stepper(Stepper *this,QWidget *parent)

{
  StepperPrivate *this_00;
  Object local_38 [8];
  code *local_30;
  undefined8 uStack_28;
  
  QWidget::QWidget(&this->super_QWidget,parent,0);
  *(undefined ***)this = &PTR_metaObject_001a8f08;
  *(undefined ***)&this->field_0x10 = &PTR__Stepper_001a90b8;
  this_00 = (StepperPrivate *)operator_new(0x48);
  StepperPrivate::StepperPrivate(this_00,this);
  (this->d).d = this_00;
  QWidget::setSizePolicy((QSizePolicy)SUB84(this,0));
  local_30 = _q_autorepeat;
  uStack_28 = 0;
  QObject::connect<void(QTimer::*)(QTimer::QPrivateSignal),void(QtMWidgets::Stepper::*)()>
            (local_38,(offset_in_QTimer_to_subr)((this->d).d)->timer,(Object *)QTimer::timeout,0,
             (ConnectionType)SUB84(this,0));
  QMetaObject::Connection::~Connection((Connection *)local_38);
  return;
}

Assistant:

Stepper::Stepper( QWidget * parent )
	:	QWidget( parent )
	,	d( new StepperPrivate( this ) )
{
	setSizePolicy( QSizePolicy( QSizePolicy::Fixed, QSizePolicy::Fixed ) );

	connect( d->timer, &QTimer::timeout,
		this, &Stepper::_q_autorepeat );
}